

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

parsing_result *
clipp::parse(parsing_result *__return_storage_ptr__,int argc,char **argv,group *cli,arg_index offset
            )

{
  const_iterator __p;
  char *pcVar1;
  size_type sVar2;
  pointer paVar3;
  pointer paVar4;
  pointer pmVar5;
  size_type sVar6;
  bool bVar7;
  long lVar8;
  parameter *ppVar9;
  size_type sVar10;
  parsing_result *__range2_1;
  arg_list *__range2;
  iterator __end2;
  char *pcVar11;
  const_iterator __begin2_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  pointer pmVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prv;
  iterator __begin2;
  pointer pbVar13;
  pointer this;
  pointer pbVar14;
  arg_list args;
  vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> local_158;
  _Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
  local_138;
  parser parse;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((offset < argc) &&
     (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::_M_assign_aux<char**>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                 argv + offset,argv + argc),
     pbVar14 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     args.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     args.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    while (pbVar13 = pbVar14, pbVar14 = pbVar13 + 1,
          pbVar14 !=
          args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      if ((((pbVar14 !=
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) && (1 < pbVar13[1]._M_string_length)) &&
          (lVar8 = std::__cxx11::string::find((char)pbVar14,0x2e), lVar8 == 0)) &&
         (__p._M_current = (pbVar14->_M_dataplus)._M_p, (int)__p._M_current[1] - 0x30U < 10)) {
        pcVar1 = (pbVar13->_M_dataplus)._M_p;
        sVar2 = pbVar13->_M_string_length;
        lVar8 = (long)sVar2 >> 2;
        sVar6 = sVar2;
        do {
          sVar10 = sVar6;
          if (lVar8 < 1) {
            pcVar11 = pcVar1 + sVar10;
            if (sVar10 != 1) {
              if (sVar10 == 3) {
                __beg._M_current = pcVar11;
                if ((int)pcVar1[2] - 0x3aU < 0xfffffff6) goto LAB_00136814;
                pcVar11 = pcVar1 + 2;
              }
              else {
                __beg._M_current = pcVar1;
                if (sVar10 != 2) goto LAB_00136814;
              }
              __beg._M_current = pcVar11;
              if ((int)pcVar11[-1] - 0x3aU < 0xfffffff6) goto LAB_00136814;
              pcVar11 = pcVar11 + -1;
            }
            __beg._M_current = pcVar11;
            if (0xfffffff5 < (int)pcVar11[-1] - 0x3aU) {
              __beg._M_current = pcVar1;
            }
            goto LAB_00136814;
          }
          if ((int)pcVar1[sVar10 - 1] - 0x3aU < 0xfffffff6) {
            __beg._M_current = pcVar1 + sVar10;
            goto LAB_00136814;
          }
          if ((int)pcVar1[sVar10 - 2] - 0x3aU < 0xfffffff6) {
            __beg._M_current = pcVar1 + (sVar10 - 1);
            goto LAB_00136814;
          }
          if ((int)pcVar1[sVar10 - 3] - 0x3aU < 0xfffffff6) {
            __beg._M_current = pcVar1 + (sVar10 - 2);
            goto LAB_00136814;
          }
          lVar8 = lVar8 + -1;
          sVar6 = sVar10 - 4;
        } while (0xfffffff5 < (int)pcVar1[sVar10 - 4] - 0x3aU);
        __beg._M_current = pcVar1 + (sVar10 - 3);
LAB_00136814:
        if ((pcVar1 < __beg._M_current) &&
           ((__beg._M_current[-1] == '-' || (__beg._M_current[-1] == '+')))) {
          __beg._M_current = __beg._M_current + -1;
        }
        std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)pbVar14,__p,__beg,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar1 + sVar2));
        std::__cxx11::string::erase
                  (pbVar13,__beg._M_current,(pbVar13->_M_dataplus)._M_p + pbVar13->_M_string_length)
        ;
      }
    }
  }
  parser::parser(&parse,cli,offset);
  pbVar14 = args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar13 == pbVar14) break;
    parser::operator()(&parse,pbVar13);
    pbVar13 = pbVar13 + 1;
  } while (parse.pos_.pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           parse.pos_.pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::vector
            (&local_158,&parse.args_);
  parser::missed((missing_events *)&local_138,&parse);
  pmVar5 = local_138._M_impl.super__Vector_impl_data._M_finish;
  pmVar12 = local_138._M_impl.super__Vector_impl_data._M_start;
  paVar4 = local_158.
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  paVar3 = local_158.
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = local_158.
         super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_158.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_start = this;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar3;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = paVar4;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_start = local_138._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_138._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_138._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::
  ~_Vector_base(&local_138);
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
            (&local_158);
  parser::~parser(&parse);
  for (; this != paVar3; this = this + 1) {
    ppVar9 = parser::arg_mapping::param(this);
    if (ppVar9 != (parameter *)0x0) {
      ppVar9 = parser::arg_mapping::param(this);
      if (this->repeat_ != 0) {
        detail::action_provider<clipp::parameter>::notify_repeated
                  (&ppVar9->super_action_provider<clipp::parameter>,this->index_);
      }
      if (this->blocked_ == true) {
        detail::action_provider<clipp::parameter>::notify_blocked
                  (&ppVar9->super_action_provider<clipp::parameter>,this->index_);
      }
      if (this->conflict_ == true) {
        detail::action_provider<clipp::parameter>::notify_conflict
                  (&ppVar9->super_action_provider<clipp::parameter>,this->index_);
      }
      bVar7 = parser::arg_mapping::any_error(this);
      if (!bVar7) {
        detail::action_provider<clipp::parameter>::execute_actions
                  (&ppVar9->super_action_provider<clipp::parameter>,&this->arg_);
      }
    }
  }
  for (; pmVar12 != pmVar5; pmVar12 = pmVar12 + 1) {
    if (pmVar12->param_ != (parameter *)0x0) {
      detail::action_provider<clipp::parameter>::notify_missing
                (&pmVar12->param_->super_action_provider<clipp::parameter>,pmVar12->aftIndex_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return __return_storage_ptr__;
}

Assistant:

inline parsing_result
parse(const int argc, char* argv[], const group& cli, arg_index offset = 1)
{
    arg_list args;
    if(offset < argc) args.assign(argv+offset, argv+argc);
    detail::sanitize_args(args);
    return detail::parse_and_execute(args, cli, offset);
}